

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void golf_lightmap_section_finalize(golf_lightmap_section_t *section)

{
  undefined8 uVar1;
  sg_buffer sVar2;
  undefined1 local_70 [8];
  sg_buffer_desc desc;
  golf_lightmap_section_t *section_local;
  
  desc._88_8_ = section;
  memset(local_70,0,0x60);
  uVar1 = desc._88_8_;
  desc.size._0_4_ = 1;
  desc._16_8_ = *(undefined8 *)(desc._88_8_ + 0x40);
  desc.data.ptr = (void *)((long)*(int *)(desc._88_8_ + 0x48) << 3);
  sVar2 = sg_make_buffer((sg_buffer_desc *)local_70);
  *(uint32_t *)(uVar1 + 0x58) = sVar2.id;
  return;
}

Assistant:

void golf_lightmap_section_finalize(golf_lightmap_section_t *section) {
    sg_buffer_desc desc = {
        .type = SG_BUFFERTYPE_VERTEXBUFFER,
        .data = {
            .size = sizeof(vec2) * section->uvs.length,
            .ptr = section->uvs.data,
        },
    };
    section->sg_uvs_buf = sg_make_buffer(&desc);
}